

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

bool test_vector_erase(void)

{
  _List_node_base *p_Var1;
  pointer piVar2;
  _List_node_base *p_Var3;
  int *__src;
  bool bVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  vector<int,_std::allocator<int>_> l;
  list<int,_std::allocator<int>_> base;
  allocator_type local_59;
  vector<int,_std::allocator<int>_> local_58;
  undefined8 local_40;
  _List_node_base local_38;
  undefined4 local_28;
  
  local_38._M_next = (_List_node_base *)0x200000001;
  local_38._M_prev = (_List_node_base *)0x400000003;
  local_28 = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_58,__l,(allocator_type *)&local_40);
  piVar2 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  while (piVar2 != local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
    if (*piVar2 < 3) {
      piVar2 = piVar2 + 1;
    }
    else {
      __src = piVar2 + 1;
      if (__src != local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
        memmove(piVar2,__src,
                (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__src);
      }
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
    }
  }
  local_40 = 0x200000001;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_40;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)&local_38,__l_00,&local_59);
  piVar2 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  p_Var3 = local_38._M_next;
  p_Var1 = local_38._M_next;
  if (local_38._M_next != &local_38 &&
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      if (*piVar2 != *(int *)&p_Var3[1]._M_next) {
        bVar4 = false;
        goto joined_r0x00105729;
      }
      piVar2 = piVar2 + 1;
      p_Var3 = (((_List_base<int,_std::allocator<int>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
    } while ((piVar2 != local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish) && (p_Var3 != &local_38));
  }
  bVar4 = p_Var3 == &local_38 &&
          piVar2 == local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
joined_r0x00105729:
  while (p_Var1 != &local_38) {
    p_Var3 = p_Var1->_M_next;
    operator_delete(p_Var1,0x18);
    p_Var1 = p_Var3;
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool test_vector_erase() {
    auto l = std::vector<int>{1, 2, 3, 4, 5};
    for (auto i = l.begin(); i != l.end();) {
        if (*i >= 3) {
            i = l.erase(i);
            continue;
        }
        i++;
    }
    auto base = std::list<int>{1, 2};
    return std::equal(l.begin(), l.end(), base.begin(), base.end());
}